

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  char cVar3;
  uchar uVar4;
  short sVar5;
  ushort uVar6;
  undefined8 uVar7;
  long lVar8;
  short sVar9;
  bool bVar10;
  char *pcVar11;
  byte bVar12;
  byte bVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  int iVar19;
  stbi__uint32 sVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  stbi__uint32 sVar24;
  stbi__uint32 sVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  stbi__jpeg *psVar31;
  long lVar32;
  void *__dest;
  uchar *puVar33;
  stbi_uc *psVar34;
  stbi__uint16 *data_00;
  void *pvVar35;
  code *pcVar36;
  stbi__context *data_01;
  undefined8 *puVar37;
  stbi_uc *psVar38;
  undefined1 uVar39;
  ulong uVar40;
  undefined8 *puVar41;
  undefined1 *puVar42;
  short sVar43;
  uint uVar44;
  uint uVar45;
  stbi_uc *psVar46;
  int id;
  uint n;
  stbi__context *psVar47;
  byte *pbVar48;
  stbi_uc **ppsVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  long lVar53;
  anon_struct_96_18_0d0905d3 *paVar54;
  stbi__result_info *ri_00;
  stbi__jpeg *psVar55;
  int iVar56;
  uint uVar57;
  uint uVar58;
  stbi__uint16 *psVar59;
  uint uVar60;
  short *psVar61;
  uint uVar62;
  ulong uVar63;
  ulong uVar64;
  stbi__uint16 *psVar65;
  bool bVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  uint local_510;
  uint local_4e8;
  stbi_uc *local_4e0;
  ulong local_4d8;
  int local_4c8;
  int local_494;
  uint local_47c;
  stbi_uc *coutput [4];
  int local_450;
  int local_44c;
  int local_448;
  short data [64];
  
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar31 = (stbi__jpeg *)malloc(0x4888);
  psVar31->s = s;
  psVar31->idct_block_kernel = stbi__idct_simd;
  psVar31->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar31->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar19 = stbi__decode_jpeg_header(psVar31,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar31);
  if (iVar19 != 0) {
    psVar31 = (stbi__jpeg *)malloc(0x4888);
    psVar31->s = s;
    psVar31->idct_block_kernel = stbi__idct_simd;
    psVar31->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar31->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar32 = 0x46d8; lVar32 != 0x4858; lVar32 = lVar32 + 0x60) {
        psVar38 = psVar31->huff_dc[0].fast + lVar32 + -8;
        psVar38[0] = '\0';
        psVar38[1] = '\0';
        psVar38[2] = '\0';
        psVar38[3] = '\0';
        psVar38[4] = '\0';
        psVar38[5] = '\0';
        psVar38[6] = '\0';
        psVar38[7] = '\0';
        psVar38[8] = '\0';
        psVar38[9] = '\0';
        psVar38[10] = '\0';
        psVar38[0xb] = '\0';
        psVar38[0xc] = '\0';
        psVar38[0xd] = '\0';
        psVar38[0xe] = '\0';
        psVar38[0xf] = '\0';
      }
      psVar31->restart_interval = 0;
      iVar19 = stbi__decode_jpeg_header(psVar31,0);
      if (iVar19 != 0) {
        paVar1 = psVar31->img_comp;
        bVar12 = stbi__get_marker(psVar31);
LAB_001244ad:
        if (bVar12 == 0xda) {
          iVar19 = stbi__get16be(psVar31->s);
          bVar12 = stbi__get8(psVar31->s);
          uVar57 = (uint)bVar12;
          psVar31->scan_n = (uint)bVar12;
          if (((byte)(bVar12 - 5) < 0xfc) ||
             (psVar47 = psVar31->s, psVar47->img_n < (int)(uint)bVar12)) {
            stbi__g_failure_reason = "bad SOS component count";
          }
          else if (iVar19 == (uint)bVar12 * 2 + 6) {
            lVar32 = 0;
            while( true ) {
              bVar12 = stbi__get8(psVar47);
              if ((int)uVar57 <= lVar32) break;
              bVar13 = stbi__get8(psVar31->s);
              psVar47 = psVar31->s;
              uVar57 = psVar47->img_n;
              uVar40 = 0;
              if (0 < (int)uVar57) {
                uVar40 = (ulong)uVar57;
              }
              paVar54 = paVar1;
              for (uVar64 = 0; uVar40 != uVar64; uVar64 = uVar64 + 1) {
                if (paVar54->id == (uint)bVar12) {
                  uVar40 = uVar64 & 0xffffffff;
                  break;
                }
                paVar54 = paVar54 + 1;
              }
              if ((uint)uVar40 == uVar57) goto LAB_00125daa;
              psVar31->img_comp[uVar40].hd = (uint)(bVar13 >> 4);
              if (0x3f < bVar13) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_00125daa;
              }
              paVar1[uVar40].ha = bVar13 & 0xf;
              if (3 < (bVar13 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_00125daa;
              }
              psVar31->order[lVar32] = (uint)uVar40;
              lVar32 = lVar32 + 1;
              uVar57 = psVar31->scan_n;
            }
            psVar31->spec_start = (uint)bVar12;
            bVar12 = stbi__get8(psVar31->s);
            psVar31->spec_end = (uint)bVar12;
            bVar12 = stbi__get8(psVar31->s);
            psVar31->succ_high = (uint)(bVar12 >> 4);
            psVar31->succ_low = bVar12 & 0xf;
            iVar19 = psVar31->spec_start;
            if (psVar31->progressive == 0) {
              if (((iVar19 == 0) && (bVar12 < 0x10)) && ((bVar12 & 0xf) == 0)) {
                psVar31->spec_end = 0x3f;
                goto LAB_001246d6;
              }
            }
            else if (((iVar19 < 0x40) && (psVar31->spec_end < 0x40)) &&
                    ((iVar19 <= psVar31->spec_end && ((bVar12 < 0xe0 && ((bVar12 & 0xf) < 0xe))))))
            {
LAB_001246d6:
              stbi__jpeg_reset(psVar31);
              if (psVar31->progressive == 0) {
                if (psVar31->scan_n == 1) {
                  iVar19 = psVar31->order[0];
                  uVar57 = psVar31->img_comp[iVar19].x + 7 >> 3;
                  iVar27 = psVar31->img_comp[iVar19].y + 7 >> 3;
                  if ((int)uVar57 < 1) {
                    uVar57 = 0;
                  }
                  iVar56 = 0;
                  if (iVar27 < 1) {
                    iVar27 = 0;
                  }
                  for (iVar50 = 0; iVar50 != iVar27; iVar50 = iVar50 + 1) {
                    for (lVar32 = 0; (ulong)uVar57 * 8 != lVar32; lVar32 = lVar32 + 8) {
                      iVar51 = stbi__jpeg_decode_block
                                         (psVar31,data,
                                          (stbi__huffman *)psVar31->huff_dc[paVar1[iVar19].hd].fast,
                                          (stbi__huffman *)psVar31->huff_ac[paVar1[iVar19].ha].fast,
                                          psVar31->fast_ac[paVar1[iVar19].ha],iVar19,
                                          psVar31->dequant[paVar1[iVar19].tq]);
                      if (iVar51 == 0) {
                        bVar66 = false;
                        goto LAB_00124f71;
                      }
                      (*psVar31->idct_block_kernel)
                                (paVar1[iVar19].data + lVar32 + iVar56 * paVar1[iVar19].w2,
                                 paVar1[iVar19].w2,data);
                      iVar51 = psVar31->todo;
                      psVar31->todo = iVar51 + -1;
                      if (iVar51 < 2) {
                        if (psVar31->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar31);
                        }
                        if ((psVar31->marker & 0xf8) != 0xd0) goto LAB_00124f6e;
                        stbi__jpeg_reset(psVar31);
                      }
                    }
                    iVar56 = iVar56 + 8;
                  }
                }
                else {
                  for (iVar19 = 0; iVar19 < psVar31->img_mcu_y; iVar19 = iVar19 + 1) {
                    for (iVar27 = 0; iVar27 < psVar31->img_mcu_x; iVar27 = iVar27 + 1) {
                      for (lVar32 = 0; lVar32 < psVar31->scan_n; lVar32 = lVar32 + 1) {
                        iVar56 = psVar31->order[lVar32];
                        for (iVar50 = 0; iVar50 < paVar1[iVar56].v; iVar50 = iVar50 + 1) {
                          for (iVar51 = 0; iVar21 = paVar1[iVar56].h, iVar51 < iVar21;
                              iVar51 = iVar51 + 1) {
                            iVar22 = paVar1[iVar56].v;
                            iVar23 = stbi__jpeg_decode_block
                                               (psVar31,data,
                                                (stbi__huffman *)
                                                psVar31->huff_dc[paVar1[iVar56].hd].fast,
                                                (stbi__huffman *)
                                                psVar31->huff_ac[paVar1[iVar56].ha].fast,
                                                psVar31->fast_ac[paVar1[iVar56].ha],iVar56,
                                                psVar31->dequant[paVar1[iVar56].tq]);
                            if (iVar23 == 0) {
                              bVar66 = false;
                              goto LAB_00124f71;
                            }
                            (*psVar31->idct_block_kernel)
                                      (paVar1[iVar56].data +
                                       (long)((iVar21 * iVar27 + iVar51) * 8) +
                                       (long)((iVar22 * iVar19 + iVar50) * paVar1[iVar56].w2 * 8),
                                       paVar1[iVar56].w2,data);
                          }
                        }
                      }
                      iVar56 = psVar31->todo;
                      psVar31->todo = iVar56 + -1;
                      if (iVar56 < 2) {
                        if (psVar31->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar31);
                        }
                        if ((psVar31->marker & 0xf8) != 0xd0) goto LAB_00124f6e;
                        stbi__jpeg_reset(psVar31);
                      }
                    }
                  }
                }
LAB_00124f6e:
                bVar66 = true;
LAB_00124f71:
                if (!bVar66) goto LAB_00125daa;
              }
              else if (psVar31->scan_n == 1) {
                iVar19 = psVar31->order[0];
                iVar27 = psVar31->img_comp[iVar19].x + 7 >> 3;
                iVar56 = psVar31->img_comp[iVar19].y + 7 >> 3;
                iVar50 = 0;
                if (iVar27 < 1) {
                  iVar27 = iVar50;
                }
                if (iVar56 < 1) {
                  iVar56 = iVar50;
                }
                for (; iVar50 != iVar56; iVar50 = iVar50 + 1) {
                  for (iVar51 = 0; iVar51 != iVar27; iVar51 = iVar51 + 1) {
                    psVar61 = paVar1[iVar19].coeff +
                              (paVar1[iVar19].coeff_w * iVar50 + iVar51) * 0x40;
                    uVar40 = (ulong)psVar31->spec_start;
                    if (uVar40 == 0) {
                      iVar21 = stbi__jpeg_decode_block_prog_dc
                                         (psVar31,psVar61,
                                          (stbi__huffman *)psVar31->huff_dc[paVar1[iVar19].hd].fast,
                                          iVar19);
                      if (iVar21 == 0) goto LAB_00125daa;
                    }
                    else {
                      iVar21 = paVar1[iVar19].ha;
                      psVar38 = psVar31->huff_ac[iVar21].fast;
                      iVar22 = psVar31->eob_run;
                      bVar12 = (byte)psVar31->succ_low;
                      if (psVar31->succ_high == 0) {
                        if (iVar22 == 0) {
                          do {
                            if (psVar31->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(psVar31);
                            }
                            sVar43 = psVar31->fast_ac[iVar21][psVar31->code_buffer >> 0x17];
                            uVar57 = (uint)sVar43;
                            iVar22 = (int)uVar40;
                            if (sVar43 == 0) {
                              uVar57 = stbi__jpeg_huff_decode(psVar31,(stbi__huffman *)psVar38);
                              if ((int)uVar57 < 0) goto LAB_00125ad3;
                              uVar58 = uVar57 >> 4;
                              if ((uVar57 & 0xf) == 0) {
                                if (uVar57 < 0xf0) {
                                  iVar22 = 1 << ((byte)uVar58 & 0x1f);
                                  psVar31->eob_run = iVar22;
                                  if (0xf < uVar57) {
                                    iVar22 = stbi__jpeg_get_bits(psVar31,uVar58);
                                    iVar22 = iVar22 + psVar31->eob_run;
                                  }
                                  goto LAB_00124877;
                                }
                                uVar40 = (ulong)(iVar22 + 0x10);
                              }
                              else {
                                lVar32 = (ulong)uVar58 + (long)iVar22;
                                uVar40 = (ulong)((int)lVar32 + 1);
                                bVar13 = ""[lVar32];
                                iVar22 = stbi__extend_receive(psVar31,uVar57 & 0xf);
                                psVar61[bVar13] = (short)(iVar22 << (bVar12 & 0x1f));
                              }
                            }
                            else {
                              lVar32 = (ulong)(uVar57 >> 4 & 0xf) + (long)iVar22;
                              psVar31->code_buffer = psVar31->code_buffer << (sbyte)(uVar57 & 0xf);
                              psVar31->code_bits = psVar31->code_bits - (uVar57 & 0xf);
                              uVar40 = (ulong)((int)lVar32 + 1);
                              psVar61[""[lVar32]] = (short)((uVar57 >> 8) << (bVar12 & 0x1f));
                            }
                          } while ((int)uVar40 <= psVar31->spec_end);
                        }
                        else {
LAB_00124877:
                          psVar31->eob_run = iVar22 + -1;
                        }
                      }
                      else if (iVar22 == 0) {
                        iVar21 = 0x10000 << (bVar12 & 0x1f);
                        do {
                          uVar57 = stbi__jpeg_huff_decode(psVar31,(stbi__huffman *)psVar38);
                          if ((int)uVar57 < 0) goto LAB_00125ad3;
                          uVar58 = uVar57 >> 4;
                          if ((uVar57 & 0xf) == 1) {
                            iVar22 = stbi__jpeg_get_bit(psVar31);
                            iVar23 = 1;
                            if (iVar22 == 0) {
                              iVar23 = 0xffff;
                            }
                            sVar43 = (short)(iVar23 << (bVar12 & 0x1f));
                          }
                          else {
                            if ((uVar57 & 0xf) != 0) {
                              stbi__g_failure_reason = "bad huffman code";
                              goto LAB_00125daa;
                            }
                            if (uVar57 < 0xf0) {
                              psVar31->eob_run = ~(-1 << ((byte)uVar58 & 0x1f));
                              if (0xf < uVar57) {
                                iVar22 = stbi__jpeg_get_bits(psVar31,uVar58);
                                psVar31->eob_run = psVar31->eob_run + iVar22;
                              }
                              uVar58 = 0x40;
                            }
                            else {
                              uVar58 = 0xf;
                            }
                            sVar43 = 0;
                          }
                          uVar64 = (long)(int)uVar40;
                          do {
                            while( true ) {
                              uVar40 = uVar64;
                              iVar22 = psVar31->spec_end;
                              if ((long)iVar22 < (long)uVar40) goto LAB_001249a7;
                              bVar13 = ""[uVar40];
                              if (psVar61[bVar13] == 0) break;
                              iVar22 = stbi__jpeg_get_bit(psVar31);
                              if ((iVar22 != 0) &&
                                 (sVar5 = psVar61[bVar13], (iVar21 >> 0x10 & (int)sVar5) == 0)) {
                                sVar9 = (short)((uint)iVar21 >> 0x10);
                                if (sVar5 < 1) {
                                  sVar9 = -sVar9;
                                }
                                psVar61[bVar13] = sVar5 + sVar9;
                              }
                              uVar64 = uVar40 + 1;
                            }
                            bVar66 = uVar58 != 0;
                            uVar58 = uVar58 - 1;
                            uVar64 = uVar40 + 1;
                          } while (bVar66);
                          psVar61[bVar13] = sVar43;
                          uVar40 = uVar40 + 1;
LAB_001249a7:
                        } while ((int)uVar40 <= iVar22);
                      }
                      else {
                        psVar31->eob_run = iVar22 + -1;
                        uVar57 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                        for (; (long)uVar40 <= (long)psVar31->spec_end; uVar40 = uVar40 + 1) {
                          bVar12 = ""[uVar40];
                          if (((psVar61[bVar12] != 0) &&
                              (iVar21 = stbi__jpeg_get_bit(psVar31), iVar21 != 0)) &&
                             (sVar43 = psVar61[bVar12], (uVar57 & (int)sVar43) == 0)) {
                            uVar58 = -uVar57;
                            if (0 < sVar43) {
                              uVar58 = uVar57;
                            }
                            psVar61[bVar12] = (short)uVar58 + sVar43;
                          }
                        }
                      }
                    }
                    iVar21 = psVar31->todo;
                    psVar31->todo = iVar21 + -1;
                    if (iVar21 < 2) {
                      if (psVar31->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar31);
                      }
                      bVar12 = psVar31->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_00124f80;
                      stbi__jpeg_reset(psVar31);
                    }
                  }
                }
              }
              else {
                for (iVar19 = 0; iVar19 < psVar31->img_mcu_y; iVar19 = iVar19 + 1) {
                  for (iVar27 = 0; iVar27 < psVar31->img_mcu_x; iVar27 = iVar27 + 1) {
                    for (lVar32 = 0; lVar32 < psVar31->scan_n; lVar32 = lVar32 + 1) {
                      iVar56 = psVar31->order[lVar32];
                      for (iVar50 = 0; iVar50 < paVar1[iVar56].v; iVar50 = iVar50 + 1) {
                        iVar51 = 0;
                        while (iVar51 < paVar1[iVar56].h) {
                          iVar21 = stbi__jpeg_decode_block_prog_dc
                                             (psVar31,paVar1[iVar56].coeff +
                                                      (paVar1[iVar56].h * iVar27 + iVar51 +
                                                      (paVar1[iVar56].v * iVar19 + iVar50) *
                                                      paVar1[iVar56].coeff_w) * 0x40,
                                              (stbi__huffman *)
                                              psVar31->huff_dc[paVar1[iVar56].hd].fast,iVar56);
                          iVar51 = iVar51 + 1;
                          if (iVar21 == 0) goto LAB_00125daa;
                        }
                      }
                    }
                    iVar56 = psVar31->todo;
                    psVar31->todo = iVar56 + -1;
                    if (iVar56 < 2) {
                      if (psVar31->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar31);
                      }
                      bVar12 = psVar31->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_00124f80;
                      stbi__jpeg_reset(psVar31);
                    }
                  }
                }
              }
              bVar12 = psVar31->marker;
LAB_00124f80:
              if (bVar12 == 0xff) {
                do {
                  iVar19 = stbi__at_eof(psVar31->s);
                  if (iVar19 != 0) goto LAB_0012452c;
                  sVar14 = stbi__get8(psVar31->s);
                } while (sVar14 != 0xff);
                sVar14 = stbi__get8(psVar31->s);
                psVar31->marker = sVar14;
              }
              goto LAB_0012452c;
            }
            stbi__g_failure_reason = "bad SOS";
          }
          else {
            stbi__g_failure_reason = "bad SOS len";
          }
          goto LAB_00125daa;
        }
        if (bVar12 == 0xdc) {
          iVar19 = stbi__get16be(psVar31->s);
          sVar20 = stbi__get16be(psVar31->s);
          if (iVar19 != 4) {
            stbi__g_failure_reason = "bad DNL len";
          }
          if (sVar20 != psVar31->s->img_y) {
            stbi__g_failure_reason = "bad DNL height";
          }
LAB_0012452c:
          bVar12 = stbi__get_marker(psVar31);
          goto LAB_001244ad;
        }
        if (bVar12 != 0xd9) {
          iVar19 = stbi__process_marker(psVar31,(uint)bVar12);
          if (iVar19 != 0) goto LAB_0012452c;
          goto LAB_00125daa;
        }
        if (psVar31->progressive == 0) {
          psVar47 = psVar31->s;
          uVar57 = psVar47->img_n;
        }
        else {
          lVar32 = 0;
          while( true ) {
            psVar47 = psVar31->s;
            uVar57 = psVar47->img_n;
            if ((int)uVar57 <= lVar32) break;
            uVar57 = psVar31->img_comp[lVar32].x + 7 >> 3;
            iVar19 = psVar31->img_comp[lVar32].y + 7 >> 3;
            uVar64 = 0;
            uVar40 = (ulong)uVar57;
            if ((int)uVar57 < 1) {
              uVar40 = uVar64;
            }
            if (iVar19 < 1) {
              iVar19 = 0;
            }
            while (iVar27 = (int)uVar64, iVar27 != iVar19) {
              for (uVar64 = 0; uVar64 != uVar40; uVar64 = uVar64 + 1) {
                psVar61 = paVar1[lVar32].coeff;
                iVar50 = paVar1[lVar32].coeff_w * iVar27;
                iVar56 = paVar1[lVar32].tq;
                iVar51 = iVar50 + (int)uVar64;
                for (lVar53 = 0; lVar53 != 0x40; lVar53 = lVar53 + 1) {
                  psVar61[iVar51 * 0x40 + lVar53] =
                       psVar61[iVar51 * 0x40 + lVar53] * psVar31->dequant[iVar56][lVar53];
                }
                (*psVar31->idct_block_kernel)
                          (paVar1[lVar32].data + uVar64 * 8 + (long)(iVar27 * 8 * paVar1[lVar32].w2)
                           ,paVar1[lVar32].w2,psVar61 + (iVar50 + (int)uVar64) * 0x40);
              }
              uVar64 = (ulong)(iVar27 + 1);
            }
            lVar32 = lVar32 + 1;
          }
        }
        uVar58 = (2 < (int)uVar57) + 1 + (uint)(2 < (int)uVar57);
        if (req_comp != 0) {
          uVar58 = req_comp;
        }
        lVar32 = 0;
        bVar66 = false;
        if ((uVar57 == 3) && (bVar66 = true, psVar31->rgb != 3)) {
          if (psVar31->app14_color_transform == 0) {
            bVar66 = psVar31->jfif == 0;
          }
          else {
            bVar66 = false;
          }
        }
        uVar40 = 0;
        if (0 < (int)uVar57) {
          uVar40 = (ulong)uVar57;
        }
        uVar64 = 1;
        if (bVar66) {
          uVar64 = uVar40;
        }
        if (2 < (int)uVar58) {
          uVar64 = uVar40;
        }
        if (uVar57 != 3) {
          uVar64 = uVar40;
        }
        do {
          if (uVar64 * 0x30 == lVar32) {
            sVar20 = psVar47->img_y;
            data_01 = (stbi__context *)stbi__malloc_mad3(uVar58,psVar47->img_x,sVar20,1);
            if (data_01 != (stbi__context *)0x0) {
              iVar19 = 0;
              uVar57 = 0;
              do {
                if (sVar20 <= uVar57) {
                  stbi__cleanup_jpeg(psVar31);
                  psVar47 = psVar31->s;
                  *x = psVar47->img_x;
                  *y = psVar47->img_y;
                  if (comp != (int *)0x0) {
                    *comp = (uint)(2 < psVar47->img_n) * 2 + 1;
                  }
                  goto LAB_00125dba;
                }
                sVar20 = psVar47->img_x;
                ppsVar49 = coutput;
                for (lVar32 = 0; uVar64 * 0x30 != lVar32; lVar32 = lVar32 + 0x30) {
                  puVar37 = (undefined8 *)((long)data + lVar32 + 0x10);
                  iVar27 = *(int *)((long)data + lVar32 + 0x24);
                  iVar56 = *(int *)((long)data + lVar32 + 0x1c);
                  iVar50 = iVar56 >> 1;
                  puVar2 = (undefined8 *)((long)data + lVar32 + 8);
                  puVar41 = puVar37;
                  if (iVar27 < iVar50) {
                    puVar41 = puVar2;
                  }
                  if (iVar50 <= iVar27) {
                    puVar37 = puVar2;
                  }
                  psVar38 = (stbi_uc *)
                            (**(code **)((long)data + lVar32))
                                      (*(undefined8 *)
                                        ((long)&psVar31->img_comp[0].linebuf + lVar32 * 2),*puVar41,
                                       *puVar37,*(undefined4 *)((long)data + lVar32 + 0x20));
                  *ppsVar49 = psVar38;
                  *(int *)((long)data + lVar32 + 0x24) = iVar27 + 1;
                  if (iVar56 <= iVar27 + 1) {
                    *(undefined4 *)((long)data + lVar32 + 0x24) = 0;
                    lVar53 = *(long *)((long)data + lVar32 + 0x10);
                    *(long *)((long)data + lVar32 + 8) = lVar53;
                    iVar27 = *(int *)((long)data + lVar32 + 0x28) + 1;
                    *(int *)((long)data + lVar32 + 0x28) = iVar27;
                    if (iVar27 < *(int *)((long)&psVar31->img_comp[0].y + lVar32 * 2)) {
                      *(long *)((long)data + lVar32 + 0x10) =
                           lVar53 + *(int *)((long)&psVar31->img_comp[0].w2 + lVar32 * 2);
                    }
                  }
                  ppsVar49 = ppsVar49 + 1;
                }
                if ((int)uVar58 < 3) {
                  psVar47 = psVar31->s;
                  if (bVar66) {
                    if (uVar58 == 1) {
                      for (uVar40 = 0; uVar40 < psVar47->img_x; uVar40 = uVar40 + 1) {
                        data_01->buffer_start[uVar40 + sVar20 * iVar19 + -0x38] =
                             (stbi_uc)((uint)*(byte *)(CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) +
                                                      uVar40) * 0x1d +
                                       (uint)*(byte *)(CONCAT44(coutput[1]._4_4_,(int)coutput[1]) +
                                                      uVar40) * 0x96 +
                                       (uint)*(byte *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) +
                                                      uVar40) * 0x4d >> 8);
                      }
                    }
                    else {
                      for (uVar40 = 0; uVar40 < psVar47->img_x; uVar40 = uVar40 + 1) {
                        data_01->buffer_start[uVar40 * 2 + (ulong)(sVar20 * iVar19) + -0x38] =
                             (stbi_uc)((uint)*(byte *)(CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) +
                                                      uVar40) * 0x1d +
                                       (uint)*(byte *)(CONCAT44(coutput[1]._4_4_,(int)coutput[1]) +
                                                      uVar40) * 0x96 +
                                       (uint)*(byte *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) +
                                                      uVar40) * 0x4d >> 8);
                        data_01->buffer_start[uVar40 * 2 + (ulong)(sVar20 * iVar19) + -0x37] = 0xff;
                      }
                    }
                  }
                  else if (psVar47->img_n == 4) {
                    if (psVar31->app14_color_transform == 2) {
                      psVar38 = data_01->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                      for (uVar40 = 0; uVar40 < psVar47->img_x; uVar40 = uVar40 + 1) {
                        iVar27 = (*(byte *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) + uVar40) ^
                                 0xff) * (uint)*(byte *)(CONCAT44(coutput[3]._4_4_,(uint)coutput[3])
                                                        + uVar40);
                        psVar38[-1] = (char)(iVar27 + (iVar27 + 0x80U >> 8) + 0x80 >> 8);
                        *psVar38 = 0xff;
                        psVar38 = psVar38 + uVar58;
                      }
                    }
                    else {
                      if (psVar31->app14_color_transform != 0) goto LAB_001268ec;
                      psVar38 = data_01->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                      for (uVar40 = 0; uVar40 < psVar47->img_x; uVar40 = uVar40 + 1) {
                        bVar12 = *(byte *)(CONCAT44(coutput[3]._4_4_,(uint)coutput[3]) + uVar40);
                        iVar27 = (uint)*(byte *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) + uVar40
                                                ) * (uint)bVar12;
                        iVar56 = (uint)*(byte *)(CONCAT44(coutput[1]._4_4_,(int)coutput[1]) + uVar40
                                                ) * (uint)bVar12;
                        iVar50 = (uint)*(byte *)(CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) +
                                                uVar40) * (uint)bVar12;
                        psVar38[-1] = (char)(((iVar50 + 0x80U >> 8) + iVar50 + 0x80 >> 8) * 0x1d +
                                             (iVar56 + (iVar56 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                             (iVar27 + (iVar27 + 0x80U >> 8) + 0x80 >> 8) * 0x4d >>
                                            8);
                        *psVar38 = 0xff;
                        psVar38 = psVar38 + uVar58;
                      }
                    }
                  }
                  else {
LAB_001268ec:
                    if (uVar58 == 1) {
                      for (uVar40 = 0; uVar40 < psVar47->img_x; uVar40 = uVar40 + 1) {
                        data_01->buffer_start[uVar40 + sVar20 * iVar19 + -0x38] =
                             *(stbi_uc *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) + uVar40);
                      }
                    }
                    else {
                      for (uVar40 = 0; uVar40 < psVar47->img_x; uVar40 = uVar40 + 1) {
                        data_01->buffer_start[uVar40 * 2 + (ulong)(sVar20 * iVar19) + -0x38] =
                             *(stbi_uc *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) + uVar40);
                        data_01->buffer_start[uVar40 * 2 + (ulong)(sVar20 * iVar19) + -0x37] = 0xff;
                      }
                    }
                  }
                }
                else {
                  psVar38 = (stbi_uc *)CONCAT44(coutput[0]._4_4_,(int)coutput[0]);
                  psVar47 = psVar31->s;
                  if (psVar47->img_n == 3) {
                    if (bVar66) {
                      psVar46 = data_01->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar40 = 0; uVar40 < psVar47->img_x; uVar40 = uVar40 + 1) {
                        psVar46[-3] = psVar38[uVar40];
                        psVar46[-2] = *(undefined1 *)
                                       (CONCAT44(coutput[1]._4_4_,(int)coutput[1]) + uVar40);
                        psVar46[-1] = *(undefined1 *)
                                       (CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) + uVar40);
                        *psVar46 = 0xff;
                        psVar46 = psVar46 + uVar58;
                      }
                    }
                    else {
LAB_0012691e:
                      (*psVar31->YCbCr_to_RGB_kernel)
                                (data_01->buffer_start + ((ulong)(uVar57 * uVar58 * sVar20) - 0x38),
                                 psVar38,(stbi_uc *)CONCAT44(coutput[1]._4_4_,(int)coutput[1]),
                                 (stbi_uc *)CONCAT44(coutput[2]._4_4_,(uint)coutput[2]),
                                 psVar47->img_x,uVar58);
                    }
                  }
                  else if (psVar47->img_n == 4) {
                    if (psVar31->app14_color_transform == 2) {
                      (*psVar31->YCbCr_to_RGB_kernel)
                                (data_01->buffer_start + ((ulong)(uVar57 * uVar58 * sVar20) - 0x38),
                                 psVar38,(stbi_uc *)CONCAT44(coutput[1]._4_4_,(int)coutput[1]),
                                 (stbi_uc *)CONCAT44(coutput[2]._4_4_,(uint)coutput[2]),
                                 psVar47->img_x,uVar58);
                      psVar47 = psVar31->s;
                      psVar38 = data_01->buffer_start + ((ulong)(sVar20 * iVar19) - 0x36);
                      for (uVar40 = 0; uVar40 < psVar47->img_x; uVar40 = uVar40 + 1) {
                        bVar12 = *(byte *)(CONCAT44(coutput[3]._4_4_,(uint)coutput[3]) + uVar40);
                        iVar27 = (psVar38[-2] ^ 0xff) * (uint)bVar12;
                        psVar38[-2] = (byte)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        iVar27 = (psVar38[-1] ^ 0xff) * (uint)bVar12;
                        psVar38[-1] = (byte)(iVar27 + (iVar27 + 0x80U >> 8) + 0x80 >> 8);
                        iVar27 = (*psVar38 ^ 0xff) * (uint)bVar12;
                        *psVar38 = (byte)(iVar27 + (iVar27 + 0x80U >> 8) + 0x80 >> 8);
                        psVar38 = psVar38 + uVar58;
                      }
                    }
                    else {
                      if (psVar31->app14_color_transform != 0) goto LAB_0012691e;
                      psVar46 = data_01->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar40 = 0; uVar40 < psVar47->img_x; uVar40 = uVar40 + 1) {
                        bVar12 = *(byte *)(CONCAT44(coutput[3]._4_4_,(uint)coutput[3]) + uVar40);
                        iVar27 = (uint)psVar38[uVar40] * (uint)bVar12;
                        psVar46[-3] = (char)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        iVar27 = (uint)((stbi_uc *)CONCAT44(coutput[1]._4_4_,(int)coutput[1]))
                                       [uVar40] * (uint)bVar12;
                        psVar46[-2] = (char)(iVar27 + (iVar27 + 0x80U >> 8) + 0x80 >> 8);
                        iVar27 = (uint)((stbi_uc *)CONCAT44(coutput[2]._4_4_,(uint)coutput[2]))
                                       [uVar40] * (uint)bVar12;
                        psVar46[-1] = (char)(iVar27 + (iVar27 + 0x80U >> 8) + 0x80 >> 8);
                        *psVar46 = 0xff;
                        psVar46 = psVar46 + uVar58;
                      }
                    }
                  }
                  else {
                    psVar46 = data_01->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                    for (uVar40 = 0; uVar40 < psVar47->img_x; uVar40 = uVar40 + 1) {
                      sVar14 = psVar38[uVar40];
                      psVar46[-1] = sVar14;
                      psVar46[-2] = sVar14;
                      psVar46[-3] = sVar14;
                      *psVar46 = 0xff;
                      psVar46 = psVar46 + uVar58;
                    }
                  }
                }
                uVar57 = uVar57 + 1;
                psVar47 = psVar31->s;
                sVar20 = psVar47->img_y;
                iVar19 = iVar19 + uVar58;
              } while( true );
            }
            stbi__cleanup_jpeg(psVar31);
LAB_00126abe:
            stbi__g_failure_reason = "outofmem";
            goto LAB_00125db7;
          }
          sVar20 = psVar47->img_x;
          pvVar35 = malloc((ulong)(sVar20 + 3));
          *(void **)((long)&psVar31->img_comp[0].linebuf + lVar32 * 2) = pvVar35;
          if (pvVar35 == (void *)0x0) {
            stbi__cleanup_jpeg(psVar31);
            goto LAB_00126abe;
          }
          uVar40 = (long)psVar31->img_h_max /
                   (long)*(int *)((long)&psVar31->img_comp[0].h + lVar32 * 2);
          iVar19 = (int)uVar40;
          *(int *)((long)data + lVar32 + 0x18) = iVar19;
          iVar27 = psVar31->img_v_max / *(int *)((long)&psVar31->img_comp[0].v + lVar32 * 2);
          *(int *)((long)data + lVar32 + 0x1c) = iVar27;
          *(int *)((long)data + lVar32 + 0x24) = iVar27 >> 1;
          *(int *)((long)data + lVar32 + 0x20) =
               (int)((ulong)((sVar20 + iVar19) - 1) / (uVar40 & 0xffffffff));
          *(undefined4 *)((long)data + lVar32 + 0x28) = 0;
          uVar7 = *(undefined8 *)((long)&psVar31->img_comp[0].data + lVar32 * 2);
          *(undefined8 *)((long)data + lVar32 + 0x10) = uVar7;
          *(undefined8 *)((long)data + lVar32 + 8) = uVar7;
          if (iVar19 == 2) {
            pcVar36 = stbi__resample_row_h_2;
            if (iVar27 != 1) {
              if (iVar27 != 2) goto LAB_00126472;
              pcVar36 = psVar31->resample_row_hv_2_kernel;
            }
          }
          else if (iVar19 == 1) {
            pcVar36 = stbi__resample_row_generic;
            if (iVar27 == 2) {
              pcVar36 = stbi__resample_row_v_2;
            }
            if (iVar27 == 1) {
              pcVar36 = resample_row_1;
            }
          }
          else {
LAB_00126472:
            pcVar36 = stbi__resample_row_generic;
          }
          *(code **)((long)data + lVar32) = pcVar36;
          lVar32 = lVar32 + 0x30;
        } while( true );
      }
LAB_00125daa:
      stbi__cleanup_jpeg(psVar31);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_00125db7:
    data_01 = (stbi__context *)0x0;
    goto LAB_00125dba;
  }
  iVar19 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar19 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    data._0_8_ = s;
    iVar19 = stbi__parse_png_file((stbi__png *)data,0,req_comp);
    uVar7 = data._0_8_;
    if (iVar19 == 0) {
      data_01 = (stbi__context *)0x0;
    }
    else {
      iVar19 = 8;
      if (8 < (int)data._32_4_) {
        iVar19 = data._32_4_;
      }
      ri->bits_per_channel = iVar19;
      data_01 = (stbi__context *)data._24_8_;
      if ((req_comp != 0) && (iVar19 = *(int *)(data._0_8_ + 0xc), iVar19 != req_comp)) {
        if ((int)data._32_4_ < 9) {
          data_01 = (stbi__context *)
                    stbi__convert_format
                              ((uchar *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_,
                               *(uint *)(data._0_8_ + 4));
        }
        else {
          data_01 = (stbi__context *)
                    stbi__convert_format16
                              ((stbi__uint16 *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_,
                               *(uint *)(data._0_8_ + 4));
        }
        *(int *)(uVar7 + 0xc) = req_comp;
        if (data_01 == (stbi__context *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(int *)uVar7;
      *y = *(int *)(uVar7 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar7 + 8);
      }
      data._24_8_ = (void *)0x0;
    }
    free((void *)data._24_8_);
    free((void *)data._16_8_);
    psVar31 = (stbi__jpeg *)data._8_8_;
    goto LAB_00125dba;
  }
  sVar14 = stbi__get8(s);
  if ((sVar14 == 'B') && (sVar14 = stbi__get8(s), sVar14 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar20 = stbi__get32le(s);
    if (((sVar20 < 0x39) && ((0x100010000001000U >> ((ulong)sVar20 & 0x3f) & 1) != 0)) ||
       ((sVar20 == 0x7c || (sVar20 == 0x6c)))) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      coutput[3]._4_4_ = 0xff;
      pvVar35 = stbi__bmp_parse_header(s,(stbi__bmp_data *)coutput);
      if (pvVar35 == (void *)0x0) {
        return (void *)0x0;
      }
      sVar20 = s->img_y;
      sVar24 = -sVar20;
      if (0 < (int)sVar20) {
        sVar24 = sVar20;
      }
      s->img_y = sVar24;
      local_4e8 = coutput[3]._4_4_;
      if ((int)coutput[1] == 0xc) {
        if ((int)coutput[0] < 0x18) {
          local_4d8 = (long)(coutput[0]._4_4_ + -0x26) / 3 & 0xffffffff;
        }
        else {
LAB_0012570e:
          local_4d8 = 0;
        }
      }
      else {
        if (0xf < (int)coutput[0]) goto LAB_0012570e;
        local_4d8 = (ulong)(uint)((coutput[0]._4_4_ - (int)coutput[1]) + -0xe >> 2);
      }
      iVar19 = 4 - (uint)((uint)coutput[3] == 0);
      s->img_n = iVar19;
      if (2 < req_comp) {
        iVar19 = req_comp;
      }
      sVar25 = s->img_x;
      iVar27 = stbi__mad3sizes_valid(iVar19,sVar25,sVar24,0);
      if (iVar27 == 0) goto LAB_00127211;
      puVar33 = (uchar *)stbi__malloc_mad3(iVar19,sVar25,sVar24,0);
      if (puVar33 == (uchar *)0x0) goto LAB_00125de8;
      if ((int)coutput[0] < 0x10) {
        iVar27 = (int)local_4d8;
        if (0x100 < iVar27 || iVar27 == 0) {
          free(puVar33);
          stbi__g_failure_reason = "invalid";
          return (void *)0x0;
        }
        uVar64 = 0;
        uVar40 = 0;
        if (0 < iVar27) {
          uVar40 = local_4d8;
        }
        for (; uVar40 != uVar64; uVar64 = uVar64 + 1) {
          sVar14 = stbi__get8(s);
          *(stbi_uc *)(data + uVar64 * 2 + 1) = sVar14;
          sVar14 = stbi__get8(s);
          *(stbi_uc *)((long)data + uVar64 * 4 + 1) = sVar14;
          sVar14 = stbi__get8(s);
          *(stbi_uc *)(data + uVar64 * 2) = sVar14;
          if ((int)coutput[1] != 0xc) {
            stbi__get8(s);
          }
          *(undefined1 *)((long)data + uVar64 * 4 + 3) = 0xff;
        }
        stbi__skip(s,(iVar27 * ((int)coutput[1] == 0xc | 0xfffffffc) - (int)coutput[1]) +
                     coutput[0]._4_4_ + -0xe);
        if ((int)coutput[0] == 8) {
          uVar57 = s->img_x;
        }
        else {
          if ((int)coutput[0] != 4) {
            free(puVar33);
            stbi__g_failure_reason = "bad bpp";
            return (void *)0x0;
          }
          uVar57 = s->img_x + 1 >> 1;
        }
        uVar40 = 0;
        for (iVar27 = 0; sVar24 = s->img_y, iVar27 < (int)sVar24; iVar27 = iVar27 + 1) {
          for (iVar56 = 0; iVar56 < (int)s->img_x; iVar56 = iVar56 + 2) {
            bVar12 = stbi__get8(s);
            uVar28 = bVar12 & 0xf;
            uVar58 = (uint)(bVar12 >> 4);
            if ((int)coutput[0] != 4) {
              uVar58 = (uint)bVar12;
            }
            uVar64 = (ulong)uVar58;
            if ((int)coutput[0] != 4) {
              uVar28 = 0;
            }
            lVar32 = (long)(int)uVar40;
            uVar63 = lVar32 + 3;
            puVar33[lVar32] = (uchar)data[uVar64 * 2];
            puVar33[lVar32 + 1] = *(uchar *)((long)data + uVar64 * 4 + 1);
            puVar33[lVar32 + 2] = (uchar)data[uVar64 * 2 + 1];
            if (iVar19 == 4) {
              puVar33[lVar32 + 3] = 0xff;
              uVar63 = (ulong)((int)uVar40 + 4);
            }
            if (iVar56 + 1U == s->img_x) {
              uVar40 = uVar63 & 0xffffffff;
              break;
            }
            if ((int)coutput[0] == 8) {
              bVar12 = stbi__get8(s);
              uVar28 = (uint)bVar12;
            }
            lVar32 = (long)(int)uVar63;
            uVar40 = lVar32 + 3;
            uVar64 = (ulong)uVar28;
            puVar33[lVar32] = (uchar)data[uVar64 * 2];
            puVar33[lVar32 + 1] = *(uchar *)((long)data + uVar64 * 4 + 1);
            puVar33[lVar32 + 2] = (uchar)data[uVar64 * 2 + 1];
            if (iVar19 == 4) {
              puVar33[lVar32 + 3] = 0xff;
              uVar40 = (ulong)((int)uVar63 + 4);
            }
          }
          stbi__skip(s,-uVar57 & 3);
        }
        goto LAB_00126bfb;
      }
      stbi__skip(s,(coutput[0]._4_4_ - (int)coutput[1]) + -0xe);
      if ((int)coutput[0] == 0x10) {
        local_47c = s->img_x * 2 & 2;
LAB_001260f8:
        if (coutput[2]._4_4_ == 0 || ((uint)coutput[2] == 0 || coutput[1]._4_4_ == 0)) {
          free(puVar33);
          stbi__g_failure_reason = "bad masks";
          return (void *)0x0;
        }
        iVar27 = stbi__high_bit(coutput[1]._4_4_);
        iVar27 = iVar27 + -7;
        iVar56 = stbi__bitcount(coutput[1]._4_4_);
        iVar50 = stbi__high_bit((uint)coutput[2]);
        iVar50 = iVar50 + -7;
        local_494 = stbi__bitcount((uint)coutput[2]);
        iVar51 = stbi__high_bit(coutput[2]._4_4_);
        iVar51 = iVar51 + -7;
        local_448 = stbi__bitcount(coutput[2]._4_4_);
        local_44c = stbi__high_bit((uint)coutput[3]);
        local_44c = local_44c + -7;
        local_450 = stbi__bitcount((uint)coutput[3]);
        bVar10 = true;
        bVar66 = false;
      }
      else {
        if ((int)coutput[0] == 0x20) {
          local_47c = 0;
          if ((uint)coutput[3] != 0xff000000 ||
              (coutput[1]._4_4_ != 0xff0000 ||
              ((uint)coutput[2] != 0xff00 || coutput[2]._4_4_ != 0xff))) goto LAB_001260f8;
          bVar66 = true;
        }
        else {
          local_47c = 0;
          if ((int)coutput[0] != 0x18) goto LAB_001260f8;
          local_47c = s->img_x & 3;
          bVar66 = false;
        }
        bVar10 = false;
        iVar27 = 0;
        iVar50 = 0;
        iVar51 = 0;
        local_44c = 0;
        iVar56 = 0;
        local_494 = 0;
        local_448 = 0;
        local_450 = 0;
      }
      iVar22 = 0;
      for (iVar21 = 0; sVar24 = s->img_y, iVar21 < (int)sVar24; iVar21 = iVar21 + 1) {
        if (bVar10) {
          for (iVar23 = 0; iVar23 < (int)s->img_x; iVar23 = iVar23 + 1) {
            if ((int)coutput[0] == 0x10) {
              uVar57 = stbi__get16le(s);
            }
            else {
              uVar57 = stbi__get32le(s);
            }
            iVar26 = stbi__shiftsigned(uVar57 & coutput[1]._4_4_,iVar27,iVar56);
            puVar33[iVar22] = (uchar)iVar26;
            iVar26 = stbi__shiftsigned(uVar57 & (uint)coutput[2],iVar50,local_494);
            puVar33[(long)iVar22 + 1] = (uchar)iVar26;
            iVar26 = stbi__shiftsigned(uVar57 & coutput[2]._4_4_,iVar51,local_448);
            puVar33[(long)iVar22 + 2] = (uchar)iVar26;
            if ((uint)coutput[3] == 0) {
              uVar57 = 0xff;
            }
            else {
              uVar57 = stbi__shiftsigned(uVar57 & (uint)coutput[3],local_44c,local_450);
            }
            iVar26 = iVar22 + 3;
            if (iVar19 == 4) {
              puVar33[(long)iVar22 + 3] = (uchar)uVar57;
              iVar26 = iVar22 + 4;
            }
            iVar22 = iVar26;
            local_4e8 = local_4e8 | uVar57;
          }
        }
        else {
          for (iVar23 = 0; iVar23 < (int)s->img_x; iVar23 = iVar23 + 1) {
            sVar14 = stbi__get8(s);
            puVar33[(long)iVar22 + 2] = sVar14;
            sVar14 = stbi__get8(s);
            puVar33[(long)iVar22 + 1] = sVar14;
            sVar14 = stbi__get8(s);
            puVar33[iVar22] = sVar14;
            bVar12 = 0xff;
            if (bVar66) {
              bVar12 = stbi__get8(s);
            }
            iVar26 = iVar22 + 3;
            if (iVar19 == 4) {
              puVar33[(long)iVar22 + 3] = bVar12;
              iVar26 = iVar22 + 4;
            }
            iVar22 = iVar26;
            local_4e8 = local_4e8 | bVar12;
          }
        }
        stbi__skip(s,local_47c);
      }
LAB_00126bfb:
      if ((iVar19 == 4) && (local_4e8 == 0)) {
        for (uVar57 = s->img_x * sVar24 * 4 - 1; -1 < (int)uVar57; uVar57 = uVar57 - 4) {
          puVar33[uVar57] = 0xff;
        }
      }
      if (0 < (int)sVar20) {
        iVar27 = (int)sVar24 >> 1;
        if ((int)sVar24 >> 1 < 1) {
          iVar27 = 0;
        }
        iVar56 = (sVar24 - 1) * iVar19;
        iVar51 = 0;
        for (iVar50 = 0; iVar50 != iVar27; iVar50 = iVar50 + 1) {
          sVar20 = s->img_x;
          uVar40 = (ulong)(sVar20 * iVar19);
          if ((int)(sVar20 * iVar19) < 1) {
            uVar40 = 0;
          }
          for (uVar64 = 0; uVar40 != uVar64; uVar64 = uVar64 + 1) {
            uVar4 = puVar33[uVar64 + sVar20 * iVar51];
            puVar33[uVar64 + sVar20 * iVar51] = puVar33[uVar64 + sVar20 * iVar56];
            puVar33[uVar64 + sVar20 * iVar56] = uVar4;
          }
          iVar56 = iVar56 - iVar19;
          iVar51 = iVar51 + iVar19;
        }
      }
      uVar57 = s->img_x;
      if ((req_comp != 0) && (iVar19 != req_comp)) {
        puVar33 = stbi__convert_format(puVar33,iVar19,req_comp,uVar57,sVar24);
        if (puVar33 == (uchar *)0x0) {
          return (void *)0x0;
        }
        uVar57 = s->img_x;
      }
      *x = uVar57;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
        return puVar33;
      }
      return puVar33;
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  sVar14 = stbi__get8(s);
  if (((((sVar14 != 'G') || (sVar14 = stbi__get8(s), sVar14 != 'I')) ||
       (sVar14 = stbi__get8(s), sVar14 != 'F')) || (sVar14 = stbi__get8(s), sVar14 != '8')) ||
     ((sVar14 = stbi__get8(s), sVar14 != '9' && (sVar14 != '7')))) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00125298:
    sVar20 = stbi__get32be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (sVar20 == 0x38425053) {
      sVar20 = stbi__get32be(s);
      if (sVar20 != 0x38425053) {
        stbi__g_failure_reason = "not PSD";
        return (void *)0x0;
      }
      iVar19 = stbi__get16be(s);
      if (iVar19 != 1) {
        stbi__g_failure_reason = "wrong version";
        return (void *)0x0;
      }
      stbi__skip(s,6);
      uVar57 = stbi__get16be(s);
      if (0x10 < uVar57) {
        stbi__g_failure_reason = "wrong channel count";
        return (void *)0x0;
      }
      sVar20 = stbi__get32be(s);
      sVar24 = stbi__get32be(s);
      iVar19 = stbi__get16be(s);
      if ((iVar19 != 8) && (iVar19 != 0x10)) {
        stbi__g_failure_reason = "unsupported bit depth";
        return (void *)0x0;
      }
      iVar27 = stbi__get16be(s);
      if (iVar27 != 3) {
        stbi__g_failure_reason = "wrong color format";
        return (void *)0x0;
      }
      sVar25 = stbi__get32be(s);
      stbi__skip(s,sVar25);
      sVar25 = stbi__get32be(s);
      stbi__skip(s,sVar25);
      sVar25 = stbi__get32be(s);
      stbi__skip(s,sVar25);
      uVar58 = stbi__get16be(s);
      if (1 < uVar58) {
        stbi__g_failure_reason = "bad compression";
        return (void *)0x0;
      }
      iVar27 = stbi__mad3sizes_valid(4,sVar24,sVar20,0);
      if (iVar27 == 0) goto LAB_00127211;
      if (((bpc == 0x10) && (iVar19 == 0x10)) && (uVar58 == 0)) {
        data_00 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar24,sVar20,0);
        ri->bits_per_channel = 0x10;
      }
      else {
        data_00 = (stbi__uint16 *)malloc((long)(int)(sVar20 * sVar24 * 4));
      }
      if (data_00 != (stbi__uint16 *)0x0) {
        uVar28 = sVar24 * sVar20;
        if (uVar58 == 0) {
          uVar40 = 0;
          psVar59 = data_00;
          psVar65 = data_00;
          uVar58 = 0;
          if (0 < (int)uVar28) {
            uVar58 = uVar28;
          }
          for (; uVar40 != 4; uVar40 = uVar40 + 1) {
            if (uVar40 < uVar57) {
              if (ri->bits_per_channel == 0x10) {
                for (lVar32 = 0; uVar58 != (uint)lVar32; lVar32 = lVar32 + 1) {
                  iVar27 = stbi__get16be(s);
                  psVar65[lVar32 * 4] = (stbi__uint16)iVar27;
                }
              }
              else if (iVar19 == 0x10) {
                for (lVar32 = 0; uVar58 != (uint)lVar32; lVar32 = lVar32 + 1) {
                  iVar27 = stbi__get16be(s);
                  *(char *)(psVar59 + lVar32 * 2) = (char)((uint)iVar27 >> 8);
                }
              }
              else {
                for (lVar32 = 0; uVar58 != (uint)lVar32; lVar32 = lVar32 + 1) {
                  sVar14 = stbi__get8(s);
                  *(stbi_uc *)(psVar59 + lVar32 * 2) = sVar14;
                }
              }
            }
            else if (iVar19 == 0x10 && bpc == 0x10) {
              for (lVar32 = 0; uVar58 != (uint)lVar32; lVar32 = lVar32 + 1) {
                psVar65[lVar32 * 4] = -(ushort)(uVar40 == 3);
              }
            }
            else {
              for (lVar32 = 0; uVar58 != (uint)lVar32; lVar32 = lVar32 + 1) {
                *(char *)(psVar59 + lVar32 * 2) = -(uVar40 == 3);
              }
            }
            psVar59 = (stbi__uint16 *)((long)psVar59 + 1);
            psVar65 = psVar65 + 1;
          }
        }
        else {
          stbi__skip(s,sVar20 * uVar57 * 2);
          uVar40 = 0;
          psVar59 = data_00;
          uVar58 = 0;
          if (0 < (int)uVar28) {
            uVar58 = uVar28;
          }
          for (; uVar40 != 4; uVar40 = uVar40 + 1) {
            if (uVar40 < uVar57) {
              psVar38 = (stbi_uc *)((long)data_00 + uVar40);
              iVar19 = 0;
              do {
                uVar45 = uVar28 - iVar19;
                do {
                  if ((int)uVar45 < 1) goto LAB_00126e48;
                  bVar12 = stbi__get8(s);
                } while (bVar12 == 0x80);
                uVar60 = (uint)bVar12;
                if ((char)bVar12 < '\0') {
                  uVar29 = 0x101 - uVar60;
                  if (uVar45 < uVar29) goto LAB_00127587;
                  sVar14 = stbi__get8(s);
                  for (iVar27 = uVar60 - 0x101; iVar27 != 0; iVar27 = iVar27 + 1) {
                    *psVar38 = sVar14;
                    psVar38 = psVar38 + 4;
                  }
                }
                else {
                  if (uVar45 <= bVar12) {
LAB_00127587:
                    free(data_00);
                    stbi__g_failure_reason = "corrupt";
                    return (void *)0x0;
                  }
                  uVar29 = uVar60 + 1;
                  uVar45 = uVar29;
                  while (bVar66 = uVar45 != 0, uVar45 = uVar45 - 1, bVar66) {
                    sVar14 = stbi__get8(s);
                    *psVar38 = sVar14;
                    psVar38 = psVar38 + 4;
                  }
                }
                iVar19 = iVar19 + uVar29;
              } while( true );
            }
            for (lVar32 = 0; uVar58 != (uint)lVar32; lVar32 = lVar32 + 1) {
              *(char *)(psVar59 + lVar32 * 2) = -(uVar40 == 3);
            }
LAB_00126e48:
            psVar59 = (stbi__uint16 *)((long)psVar59 + 1);
          }
        }
        if (3 < uVar57) {
          uVar40 = 0;
          if (0 < (int)uVar28) {
            uVar40 = (ulong)uVar28;
          }
          if (ri->bits_per_channel == 0x10) {
            for (uVar64 = 0; uVar40 != uVar64; uVar64 = uVar64 + 1) {
              uVar6 = data_00[uVar64 * 4 + 3];
              if ((uVar6 != 0) && (uVar6 != 0xffff)) {
                fVar68 = 1.0 / ((float)uVar6 / 65535.0);
                fVar67 = (1.0 - fVar68) * 65535.0;
                auVar69._0_4_ =
                     (int)(fVar67 + fVar68 * (float)(*(uint *)(data_00 + uVar64 * 4) & 0xffff));
                auVar69._4_4_ =
                     (int)(fVar67 + fVar68 * (float)(*(uint *)(data_00 + uVar64 * 4) >> 0x10));
                auVar69._8_4_ = (int)(fVar67 + fVar68 * 0.0);
                auVar69._12_4_ = (int)(fVar67 + fVar68 * 0.0);
                auVar69 = pshuflw(auVar69,auVar69,0xe8);
                *(int *)(data_00 + uVar64 * 4) = auVar69._0_4_;
                data_00[uVar64 * 4 + 2] =
                     (stbi__uint16)(int)((float)data_00[uVar64 * 4 + 2] * fVar68 + fVar67);
              }
            }
          }
          else {
            for (uVar64 = 0; uVar40 != uVar64; uVar64 = uVar64 + 1) {
              bVar12 = *(byte *)((long)data_00 + uVar64 * 4 + 3);
              if ((bVar12 != 0) && (bVar12 != 0xff)) {
                fVar68 = 1.0 / ((float)bVar12 / 255.0);
                fVar67 = (1.0 - fVar68) * 255.0;
                *(char *)(data_00 + uVar64 * 2) =
                     (char)(int)((float)(byte)data_00[uVar64 * 2] * fVar68 + fVar67);
                *(char *)((long)data_00 + uVar64 * 4 + 1) =
                     (char)(int)((float)*(byte *)((long)data_00 + uVar64 * 4 + 1) * fVar68 + fVar67)
                ;
                *(char *)(data_00 + uVar64 * 2 + 1) =
                     (char)(int)((float)(byte)data_00[uVar64 * 2 + 1] * fVar68 + fVar67);
              }
            }
          }
        }
        if ((req_comp & 0xfffffffbU) != 0) {
          if (ri->bits_per_channel == 0x10) {
            data_00 = stbi__convert_format16(data_00,4,req_comp,sVar24,sVar20);
          }
          else {
            data_00 = (stbi__uint16 *)
                      stbi__convert_format((uchar *)data_00,4,req_comp,sVar24,sVar20);
          }
          if (data_00 == (stbi__uint16 *)0x0) {
            return (void *)0x0;
          }
        }
        if (comp != (int *)0x0) {
          *comp = 4;
        }
        *y = sVar20;
        *x = sVar24;
        return data_00;
      }
      goto LAB_00125de8;
    }
    iVar19 = stbi__pic_is4(s,anon_var_dwarf_a207b);
    if (iVar19 == 0) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    else {
      iVar19 = 0x54;
      while (bVar66 = iVar19 != 0, iVar19 = iVar19 + -1, bVar66) {
        stbi__get8(s);
      }
      iVar19 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (iVar19 != 0) {
        iVar19 = 0x5c;
        while (bVar66 = iVar19 != 0, iVar19 = iVar19 + -1, bVar66) {
          stbi__get8(s);
        }
        uVar57 = stbi__get16be(s);
        uVar58 = stbi__get16be(s);
        iVar19 = stbi__at_eof(s);
        if (iVar19 != 0) {
          stbi__g_failure_reason = "bad file";
          return (void *)0x0;
        }
        bVar12 = 0;
        iVar19 = stbi__mad3sizes_valid(uVar57,uVar58,4,0);
        if (iVar19 == 0) goto LAB_00127211;
        stbi__get32be(s);
        stbi__get16be(s);
        stbi__get16be(s);
        psVar31 = (stbi__jpeg *)stbi__malloc_mad3(uVar57,uVar58,4,0);
        memset(psVar31,0xff,(ulong)(uVar57 * 4 * uVar58));
        pbVar48 = (byte *)(data + 1);
        lVar32 = 0;
        do {
          if (lVar32 == 10) {
LAB_00125dd4:
            stbi__g_failure_reason = "bad format";
            goto LAB_00125f93;
          }
          sVar14 = stbi__get8(s);
          bVar13 = stbi__get8(s);
          pbVar48[-2] = bVar13;
          bVar16 = stbi__get8(s);
          pbVar48[-1] = bVar16;
          bVar16 = stbi__get8(s);
          *pbVar48 = bVar16;
          iVar19 = stbi__at_eof(s);
          if (iVar19 != 0) {
            stbi__g_failure_reason = "bad file";
            goto LAB_00125f93;
          }
          if (bVar13 != 8) goto LAB_00125dd4;
          bVar12 = bVar12 | bVar16;
          pbVar48 = pbVar48 + 3;
          lVar32 = lVar32 + 1;
        } while (sVar14 != '\0');
        local_4c8 = 4 - (uint)((bVar12 & 0x10) == 0);
        if (comp != (int *)0x0) {
          *comp = local_4c8;
        }
        for (uVar40 = 0; uVar40 != uVar58; uVar40 = uVar40 + 1) {
          psVar38 = psVar31->huff_dc[0].fast + (long)(int)(uVar57 * 4 * (int)uVar40) + -8;
          for (lVar53 = 0; lVar32 != lVar53; lVar53 = lVar53 + 1) {
            lVar8 = lVar53 * 3;
            cVar3 = *(char *)((long)data + lVar8 + 1);
            psVar46 = psVar38;
            uVar28 = uVar57;
            if (cVar3 == '\0') {
              while (bVar66 = uVar28 != 0, uVar28 = uVar28 - 1, bVar66) {
                psVar34 = stbi__readval(s,(uint)*(byte *)((long)data + lVar8 + 2),psVar46);
                if (psVar34 == (stbi_uc *)0x0) goto LAB_00125f93;
                psVar46 = psVar46 + 4;
              }
            }
            else if (cVar3 == '\x01') {
              for (; 0 < (int)uVar28; uVar28 = uVar28 - (uVar45 & 0xff)) {
                bVar12 = stbi__get8(s);
                iVar19 = stbi__at_eof(s);
                if (iVar19 != 0) goto LAB_00126f35;
                psVar34 = stbi__readval(s,(uint)*(byte *)((long)data + lVar8 + 2),(stbi_uc *)coutput
                                       );
                if (psVar34 == (stbi_uc *)0x0) goto LAB_00125f93;
                uVar45 = (uint)bVar12;
                if (uVar28 < bVar12) {
                  uVar45 = uVar28;
                }
                uVar60 = uVar45 & 0xff;
                while (bVar66 = uVar60 != 0, uVar60 = uVar60 - 1, bVar66) {
                  stbi__copyval((uint)*(byte *)((long)data + lVar8 + 2),psVar46,(stbi_uc *)coutput);
                  psVar46 = psVar46 + 4;
                }
              }
            }
            else {
              if (cVar3 != '\x02') {
                stbi__g_failure_reason = "bad format";
                goto LAB_00125f93;
              }
              for (; 0 < (int)uVar28; uVar28 = uVar28 - iVar19) {
                bVar12 = stbi__get8(s);
                iVar19 = stbi__at_eof(s);
                if (iVar19 != 0) goto LAB_00126f35;
                uVar45 = (uint)bVar12;
                if ((char)bVar12 < '\0') {
                  if (uVar45 == 0x80) {
                    iVar19 = stbi__get16be(s);
                  }
                  else {
                    iVar19 = uVar45 - 0x7f;
                  }
                  if ((int)uVar28 < iVar19) goto LAB_00126f35;
                  psVar34 = stbi__readval(s,(uint)*(byte *)((long)data + lVar8 + 2),
                                          (stbi_uc *)coutput);
                  iVar27 = iVar19;
                  if (psVar34 == (stbi_uc *)0x0) goto LAB_00125f93;
                  while (iVar27 != 0) {
                    stbi__copyval((uint)*(byte *)((long)data + lVar8 + 2),psVar46,(stbi_uc *)coutput
                                 );
                    psVar46 = psVar46 + 4;
                    iVar27 = iVar27 + -1;
                  }
                }
                else {
                  iVar19 = bVar12 + 1;
                  iVar27 = iVar19;
                  if (uVar28 <= uVar45) goto LAB_00126f35;
                  while (bVar66 = iVar27 != 0, iVar27 = iVar27 + -1, bVar66) {
                    psVar34 = stbi__readval(s,(uint)*(byte *)((long)data + lVar8 + 2),psVar46);
                    if (psVar34 == (stbi_uc *)0x0) goto LAB_00125f93;
                    psVar46 = psVar46 + 4;
                  }
                }
              }
            }
          }
        }
        if (psVar31 == (stbi__jpeg *)0x0) goto LAB_00125f93;
        goto LAB_00125f9a;
      }
    }
    sVar14 = stbi__get8(s);
    sVar15 = stbi__get8(s);
    if ((sVar14 == 'P') && (0xfd < (byte)(sVar15 - 0x37))) {
      iVar19 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
      if (iVar19 == 0) {
        return (void *)0x0;
      }
      *x = s->img_x;
      sVar20 = s->img_y;
      *y = sVar20;
      iVar19 = s->img_n;
      if (comp != (int *)0x0) {
        *comp = iVar19;
        sVar20 = s->img_y;
      }
      sVar24 = s->img_x;
      iVar27 = stbi__mad3sizes_valid(iVar19,sVar24,sVar20,0);
      if (iVar27 == 0) goto LAB_00127211;
      puVar33 = (uchar *)stbi__malloc_mad3(iVar19,sVar24,sVar20,0);
      if (puVar33 != (uchar *)0x0) {
        stbi__getn(s,puVar33,sVar20 * iVar19 * sVar24);
        if (req_comp == 0) {
          return puVar33;
        }
        iVar19 = s->img_n;
        if (iVar19 != req_comp) {
          puVar33 = stbi__convert_format(puVar33,iVar19,req_comp,s->img_x,s->img_y);
          return puVar33;
        }
        return puVar33;
      }
      goto LAB_00125de8;
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar19 = stbi__hdr_test(s);
    if (iVar19 != 0) {
      psVar31 = (stbi__jpeg *)stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
      if (req_comp == 0) {
        req_comp = *comp;
      }
      if (psVar31 == (stbi__jpeg *)0x0) {
        return (void *)0x0;
      }
      iVar19 = *x;
      iVar27 = *y;
      data_01 = (stbi__context *)stbi__malloc_mad3(iVar19,iVar27,req_comp,0);
      if (data_01 != (stbi__context *)0x0) {
        uVar57 = (req_comp + (req_comp & 1U)) - 1;
        uVar58 = iVar27 * iVar19;
        if ((int)uVar57 < 1) {
          uVar57 = 0;
        }
        lVar32 = (long)req_comp;
        uVar40 = (ulong)uVar58;
        if ((int)uVar58 < 1) {
          uVar40 = 0;
        }
        psVar47 = data_01;
        psVar55 = psVar31;
        for (uVar64 = 0; uVar64 != uVar40; uVar64 = uVar64 + 1) {
          for (uVar63 = 0; uVar57 != uVar63; uVar63 = uVar63 + 1) {
            fVar67 = powf(*(float *)(psVar55->huff_dc[0].fast + uVar63 * 4 + -8) * stbi__h2l_scale_i
                          ,stbi__h2l_gamma_i);
            fVar68 = fVar67 * 255.0 + 0.5;
            fVar67 = 0.0;
            if (0.0 <= fVar68) {
              fVar67 = fVar68;
            }
            fVar68 = 255.0;
            if (fVar67 <= 255.0) {
              fVar68 = fVar67;
            }
            psVar47->buffer_start[uVar63 - 0x38] = (stbi_uc)(int)fVar68;
          }
          if ((int)uVar57 < req_comp) {
            lVar53 = uVar64 * lVar32 + (ulong)uVar57;
            fVar68 = *(float *)(psVar31->huff_dc[0].fast + lVar53 * 4 + -8) * 255.0 + 0.5;
            fVar67 = 0.0;
            if (0.0 <= fVar68) {
              fVar67 = fVar68;
            }
            fVar68 = 255.0;
            if (fVar67 <= 255.0) {
              fVar68 = fVar67;
            }
            data_01->buffer_start[lVar53 + -0x38] = (stbi_uc)(int)fVar68;
          }
          psVar47 = (stbi__context *)(psVar47->buffer_start + lVar32 + -0x38);
          psVar55 = (stbi__jpeg *)(psVar55->huff_dc[0].fast + lVar32 * 4 + -8);
        }
        goto LAB_00125dba;
      }
LAB_00125de3:
      free(psVar31);
LAB_00125de8:
      stbi__g_failure_reason = "outofmem";
      return (void *)0x0;
    }
    stbi__get8(s);
    bVar12 = stbi__get8(s);
    if (bVar12 < 2) {
      bVar13 = stbi__get8(s);
      if (bVar12 == 1) {
        if ((bVar13 & 0xf7) == 1) {
          iVar19 = 4;
          stbi__skip(s,4);
          bVar13 = stbi__get8(s);
          if ((bVar13 < 0x21) && ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) != 0))
          goto LAB_00125f1d;
        }
      }
      else if ((bVar13 & 0xf6) == 2) {
        iVar19 = 9;
LAB_00125f1d:
        stbi__skip(s,iVar19);
        iVar19 = stbi__get16le(s);
        if ((iVar19 != 0) && (iVar19 = stbi__get16le(s), iVar19 != 0)) {
          bVar13 = stbi__get8(s);
          if (bVar12 == 1) {
            s->img_buffer = s->img_buffer_original;
            s->img_buffer_end = s->img_buffer_original_end;
            if ((bVar13 - 8 & 0xf7) != 0) goto LAB_00125ca6;
          }
          else {
            if ((0x20 < bVar13) || ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) == 0))
            goto LAB_00125c96;
            s->img_buffer = s->img_buffer_original;
            s->img_buffer_end = s->img_buffer_original_end;
          }
          bVar13 = stbi__get8(s);
          sVar14 = stbi__get8(s);
          bVar16 = stbi__get8(s);
          iVar19 = stbi__get16le(s);
          uVar45 = stbi__get16le(s);
          bVar12 = stbi__get8(s);
          stbi__get16le(s);
          stbi__get16le(s);
          uVar57 = stbi__get16le(s);
          uVar58 = stbi__get16le(s);
          bVar17 = stbi__get8(s);
          data._0_8_ = (ulong)(uint)data._4_4_ << 0x20;
          bVar18 = stbi__get8(s);
          coutput[0]._0_4_ = 0;
          if (sVar14 == '\0') {
            uVar28 = bVar16 - 8;
            if (bVar16 < 8) {
              uVar28 = (uint)bVar16;
            }
            uVar28 = (uint)(uVar28 == 3);
            bVar12 = bVar17;
          }
          else {
            uVar28 = 0;
          }
          uVar28 = stbi__tga_get_comp((uint)bVar12,uVar28,(int *)data);
          if (uVar28 == 0) {
            stbi__g_failure_reason = "bad format";
            return (void *)0x0;
          }
          *x = uVar57;
          *y = uVar58;
          if (comp != (int *)0x0) {
            *comp = uVar28;
          }
          iVar27 = stbi__mad3sizes_valid(uVar57,uVar58,uVar28,0);
          if (iVar27 == 0) {
LAB_00127211:
            stbi__g_failure_reason = "too large";
            return (void *)0x0;
          }
          psVar31 = (stbi__jpeg *)stbi__malloc_mad3(uVar57,uVar58,uVar28,0);
          if (psVar31 == (stbi__jpeg *)0x0) goto LAB_00125de8;
          stbi__skip(s,(uint)bVar13);
          uVar40 = (ulong)uVar28;
          if (((sVar14 == '\0') && (bVar16 < 8)) && (data._0_4_ == 0)) {
            uVar60 = 0;
            uVar45 = uVar58;
            while (uVar45 = uVar45 - 1, uVar45 != 0xffffffff) {
              uVar29 = uVar60;
              if ((bVar18 >> 5 & 1) == 0) {
                uVar29 = uVar45;
              }
              stbi__getn(s,psVar31->huff_dc[0].fast + (long)(int)(uVar29 * uVar28 * uVar57) + -8,
                         uVar28 * uVar57);
              uVar60 = uVar60 + 1;
            }
          }
          else {
            if (sVar14 == '\0') {
              local_4e0 = (stbi_uc *)0x0;
            }
            else {
              stbi__skip(s,iVar19);
              local_4e0 = (stbi_uc *)stbi__malloc_mad2(uVar45,uVar28,0);
              if (local_4e0 == (stbi_uc *)0x0) goto LAB_00125de3;
              if (data._0_4_ == 0) {
                iVar19 = stbi__getn(s,local_4e0,uVar28 * uVar45);
                if (iVar19 == 0) {
                  free(psVar31);
                  free(local_4e0);
                  stbi__g_failure_reason = "bad palette";
                  return (void *)0x0;
                }
              }
              else {
                if (uVar28 != 3) {
                  __assert_fail("tga_comp == STBI_rgb",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                                ,0x1545,
                                "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                               );
                }
                for (lVar32 = 0; uVar45 * 3 != (int)lVar32; lVar32 = lVar32 + 3) {
                  stbi__tga_read_rgb16(s,local_4e0 + lVar32);
                }
              }
            }
            bVar66 = true;
            iVar19 = 0;
            uVar60 = 0;
            psVar55 = psVar31;
            for (uVar64 = 0; uVar64 != uVar58 * uVar57; uVar64 = uVar64 + 1) {
              if (bVar16 < 8) {
LAB_001276ee:
                if (sVar14 == '\0') {
                  if (data._0_4_ == 0) {
                    for (uVar63 = 0; uVar40 != uVar63; uVar63 = uVar63 + 1) {
                      sVar15 = stbi__get8(s);
                      *(stbi_uc *)((long)coutput + uVar63) = sVar15;
                    }
                  }
                  else {
                    if (uVar28 != 3) {
                      __assert_fail("tga_comp == STBI_rgb",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                                    ,0x1576,
                                    "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                   );
                    }
                    stbi__tga_read_rgb16(s,(stbi_uc *)coutput);
                  }
                }
                else {
                  if (bVar17 == 8) {
                    bVar12 = stbi__get8(s);
                    uVar29 = (uint)bVar12;
                  }
                  else {
                    uVar29 = stbi__get16le(s);
                  }
                  if (uVar45 <= uVar29) {
                    uVar29 = 0;
                  }
                  for (uVar63 = 0; uVar40 != uVar63; uVar63 = uVar63 + 1) {
                    *(stbi_uc *)((long)coutput + uVar63) = local_4e0[uVar63 + uVar29 * uVar28];
                  }
                }
              }
              else {
                if (iVar19 == 0) {
                  bVar12 = stbi__get8(s);
                  iVar19 = (bVar12 & 0x7f) + 1;
                  uVar60 = (uint)(bVar12 >> 7);
                  goto LAB_001276ee;
                }
                if (uVar60 == 0 || bVar66) {
                  uVar60 = (uint)(uVar60 != 0);
                  goto LAB_001276ee;
                }
                uVar60 = 1;
              }
              for (uVar63 = 0; uVar40 != uVar63; uVar63 = uVar63 + 1) {
                psVar55->huff_dc[0].fast[uVar63 - 8] = *(stbi_uc *)((long)coutput + uVar63);
              }
              iVar19 = iVar19 + -1;
              psVar55 = (stbi__jpeg *)(psVar55->huff_dc[0].fast + (uVar40 - 8));
              bVar66 = false;
            }
            if ((bVar18 >> 5 & 1) == 0) {
              iVar19 = uVar28 * uVar57;
              iVar27 = (uVar58 - 1) * iVar19;
              uVar45 = 0;
              for (uVar60 = 0; uVar60 != uVar58 + 1 >> 1; uVar60 = uVar60 + 1) {
                psVar55 = psVar31;
                for (iVar56 = iVar19; 0 < iVar56; iVar56 = iVar56 + -1) {
                  sVar14 = psVar55->huff_dc[0].fast[(ulong)uVar45 - 8];
                  psVar55->huff_dc[0].fast[(ulong)uVar45 - 8] =
                       psVar55->huff_dc[0].fast[(long)iVar27 + -8];
                  psVar55->huff_dc[0].fast[(long)iVar27 + -8] = sVar14;
                  psVar55 = (stbi__jpeg *)((long)&psVar55->s + 1);
                }
                uVar45 = uVar45 + iVar19;
                iVar27 = iVar27 - iVar19;
              }
            }
            free(local_4e0);
          }
          if ((2 < uVar28) && (data._0_4_ == 0)) {
            iVar19 = uVar58 * uVar57;
            puVar42 = (undefined1 *)((long)&psVar31->s + 2);
            while (bVar66 = iVar19 != 0, iVar19 = iVar19 + -1, bVar66) {
              uVar39 = puVar42[-2];
              puVar42[-2] = *puVar42;
              *puVar42 = uVar39;
              puVar42 = puVar42 + uVar40;
            }
          }
          if (req_comp == 0) {
            return psVar31;
          }
          if (uVar28 == req_comp) {
            return psVar31;
          }
LAB_00125fda:
          puVar33 = stbi__convert_format((uchar *)psVar31,uVar28,req_comp,uVar57,uVar58);
          return puVar33;
        }
      }
    }
LAB_00125c96:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00125ca6:
    stbi__g_failure_reason = "unknown image type";
    return (void *)0x0;
  }
  sVar14 = stbi__get8(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar14 != 'a') goto LAB_00125298;
  psVar31 = (stbi__jpeg *)calloc(1,0x4860);
  iVar19 = stbi__gif_header(s,(stbi__gif *)psVar31,comp,0);
  pcVar11 = stbi__g_failure_reason;
  if (iVar19 == 0) goto LAB_0012744e;
  local_510 = 0xffffffff;
  iVar19 = *(int *)&psVar31->s;
  iVar27 = *(int *)((long)&psVar31->s + 4);
  iVar56 = stbi__mad3sizes_valid(iVar19,iVar27,4,0);
  if (iVar56 == 0) {
    pcVar11 = "too large";
    goto LAB_0012744e;
  }
  pvVar35 = *(void **)psVar31->huff_dc[0].fast;
  __dest = stbi__malloc_mad3(4,iVar19,iVar27,0);
  *(void **)psVar31->huff_dc[0].fast = __dest;
  if (__dest == (void *)0x0) {
    pcVar11 = "outofmem";
    goto LAB_0012744e;
  }
  switch(*(uint *)(psVar31->huff_dc[0].fast + 0x20) >> 2 & 7) {
  case 0:
    iVar19 = iVar19 * 4;
    iVar27 = iVar27 * iVar19;
    iVar56 = 0;
    iVar50 = 0;
    goto LAB_0012725f;
  case 1:
    if (pvVar35 != (void *)0x0) {
      memcpy(__dest,pvVar35,(long)(iVar19 * iVar27 * 4));
    }
    *(void **)(psVar31->huff_dc[0].fast + 8) = pvVar35;
    break;
  case 2:
    if (pvVar35 != (void *)0x0) {
      memcpy(__dest,pvVar35,(long)(iVar19 * iVar27 * 4));
    }
    iVar56 = psVar31->eob_run;
    iVar50 = psVar31->jfif;
    iVar19 = psVar31->app14_color_transform;
    iVar27 = psVar31->rgb;
LAB_0012725f:
    stbi__fill_gif_background((stbi__gif *)psVar31,iVar56,iVar50,iVar19,iVar27);
    break;
  case 3:
    if (*(long *)(psVar31->huff_dc[0].fast + 8) != 0) {
      for (iVar19 = psVar31->jfif; iVar19 < psVar31->rgb; iVar19 = iVar19 + *(int *)&psVar31->s * 4)
      {
        lVar32 = (long)iVar19 + (long)psVar31->eob_run;
        memcpy((void *)(*(long *)psVar31->huff_dc[0].fast + lVar32),
               (void *)(lVar32 + *(long *)(psVar31->huff_dc[0].fast + 8)),
               (long)psVar31->app14_color_transform - (long)psVar31->eob_run);
      }
    }
  }
  while (sVar14 = stbi__get8(s), sVar14 == '!') {
    sVar14 = stbi__get8(s);
    if (sVar14 == 0xf9) {
      bVar12 = stbi__get8(s);
      if (bVar12 == 4) {
        bVar12 = stbi__get8(s);
        *(uint *)(psVar31->huff_dc[0].fast + 0x20) = (uint)bVar12;
        iVar19 = stbi__get16le(s);
        *(int *)(psVar31->huff_dc[0].fast + 0x24) = iVar19;
        bVar12 = stbi__get8(s);
        *(uint *)(psVar31->huff_dc[0].fast + 0x1c) = (uint)bVar12;
        goto LAB_00127326;
      }
      stbi__skip(s,(uint)bVar12);
    }
    else {
LAB_00127326:
      while (bVar12 = stbi__get8(s), bVar12 != 0) {
        stbi__skip(s,(uint)bVar12);
      }
    }
  }
  pcVar11 = stbi__g_failure_reason;
  if (sVar14 != ';') {
    if (sVar14 == ',') {
      iVar19 = stbi__get16le(s);
      iVar27 = stbi__get16le(s);
      iVar56 = stbi__get16le(s);
      iVar50 = stbi__get16le(s);
      pcVar11 = "bad Image Descriptor";
      if ((iVar56 + iVar19 <= *(int *)&psVar31->s) &&
         (iVar50 + iVar27 <= *(int *)((long)&psVar31->s + 4))) {
        iVar51 = *(int *)&psVar31->s * 4;
        psVar31->order[1] = iVar51;
        psVar31->eob_run = iVar19 << 2;
        psVar31->jfif = iVar27 * iVar51;
        psVar31->app14_color_transform = (iVar56 + iVar19) * 4;
        psVar31->rgb = iVar51 * (iVar50 + iVar27);
        psVar31->scan_n = iVar19 << 2;
        psVar31->order[0] = iVar27 * iVar51;
        bVar12 = stbi__get8(s);
        psVar31->succ_low = (uint)bVar12;
        iVar19 = psVar31->order[1] * 8;
        if ((bVar12 & 0x40) == 0) {
          iVar19 = psVar31->order[1];
        }
        psVar31->succ_high = iVar19;
        psVar31->spec_end = (int)((uint)bVar12 << 0x19) >> 0x1f & 3;
        if ((char)bVar12 < '\0') {
          psVar38 = psVar31->huff_dc[0].values + 0x28;
          iVar19 = -1;
          if ((psVar31->huff_dc[0].fast[0x20] & 1) != 0) {
            iVar19 = *(int *)(psVar31->huff_dc[0].fast + 0x1c);
          }
          stbi__gif_parse_colortable(s,(stbi_uc (*) [4])psVar38,2 << (bVar12 & 7),iVar19);
        }
        else {
          if ((psVar31->huff_dc[0].fast[0x10] & 0x80) == 0) {
            pcVar11 = "missing color table";
            goto LAB_0012744e;
          }
          lVar32 = (long)*(int *)(psVar31->huff_dc[0].fast + 0x1c);
          local_510 = 0xffffffff;
          if ((-1 < lVar32) && ((psVar31->huff_dc[0].fast[0x20] & 1) != 0)) {
            local_510 = (uint)psVar31->huff_dc[0].fast[lVar32 * 4 + 0x2b];
            psVar31->huff_dc[0].fast[lVar32 * 4 + 0x2b] = '\0';
          }
          psVar38 = psVar31->huff_dc[0].fast + 0x28;
        }
        *(stbi_uc **)&psVar31->progressive = psVar38;
        bVar12 = stbi__get8(s);
        pcVar11 = stbi__g_failure_reason;
        if (bVar12 < 0xd) {
          uVar57 = 1 << (bVar12 & 0x1f);
          for (uVar40 = 0; uVar57 != uVar40; uVar40 = uVar40 + 1) {
            psVar31->huff_dc[1].code[uVar40 * 2 + -0x34] = 0xffff;
            *(char *)(psVar31->huff_dc[1].code + uVar40 * 2 + -0x33) = (char)uVar40;
            *(char *)((long)psVar31->huff_dc[1].code + uVar40 * 4 + -0x65) = (char)uVar40;
          }
          uVar29 = (2 << (bVar12 & 0x1f)) - 1;
          n = 0;
          iVar19 = 0;
          uVar58 = 0;
          bVar13 = 0;
          uVar28 = 0xffffffff;
          uVar45 = uVar57 + 2;
          iVar27 = bVar12 + 1;
          uVar60 = uVar29;
LAB_00127949:
          do {
            for (; uVar30 = uVar60, iVar56 = iVar27, uVar44 = uVar45, uVar52 = uVar28,
                bVar16 = bVar13, iVar27 = iVar19 - iVar56, iVar19 < iVar56; iVar19 = iVar19 + 8) {
              if (n == 0) {
                bVar13 = stbi__get8(s);
                if (bVar13 == 0) goto LAB_00127afc;
                n = (uint)bVar13;
              }
              n = n - 1;
              bVar13 = stbi__get8(s);
              bVar17 = (byte)iVar19;
              uVar58 = uVar58 | (uint)bVar13 << (bVar17 & 0x1f);
              bVar13 = bVar16;
              uVar28 = uVar52;
              uVar45 = uVar44;
              iVar27 = iVar56;
              uVar60 = uVar30;
            }
            uVar28 = (int)uVar58 >> ((byte)iVar56 & 0x1f);
            uVar62 = uVar58 & uVar30;
            bVar13 = 1;
            iVar19 = iVar27;
            uVar58 = uVar28;
            uVar28 = 0xffffffff;
            uVar45 = uVar57 + 2;
            iVar27 = bVar12 + 1;
            uVar60 = uVar29;
          } while (uVar62 == uVar57);
          if (uVar62 == uVar57 + 1) goto LAB_00127ae3;
          if ((int)uVar44 < (int)uVar62) {
            pcVar11 = "illegal code in raster";
            goto LAB_0012744e;
          }
          pcVar11 = "no clear code";
          if ((bool)(bVar16 ^ 1)) goto LAB_0012744e;
          if ((int)uVar52 < 0) {
            if (uVar62 == uVar44) goto LAB_00127b7a;
          }
          else {
            if (0xfff < (int)uVar44) {
              pcVar11 = "too many codes";
              goto LAB_0012744e;
            }
            lVar32 = (long)(int)uVar44;
            uVar44 = uVar44 + 1;
            psVar31->huff_dc[1].code[lVar32 * 2 + -0x34] = (stbi__uint16)uVar52;
            uVar39 = (undefined1)psVar31->huff_dc[1].code[(ulong)uVar52 * 2 + -0x33];
            *(undefined1 *)(psVar31->huff_dc[1].code + lVar32 * 2 + -0x33) = uVar39;
            if (uVar62 != uVar44) {
              uVar39 = (undefined1)psVar31->huff_dc[1].code[(long)(int)uVar62 * 2 + -0x33];
            }
            *(undefined1 *)((long)psVar31->huff_dc[1].code + lVar32 * 4 + -0x65) = uVar39;
          }
          stbi__out_gif_code((stbi__gif *)psVar31,(stbi__uint16)uVar62);
          uVar28 = uVar62;
          uVar45 = uVar44;
          iVar27 = iVar56 + 1;
          uVar60 = ~(-1 << ((byte)(iVar56 + 1) & 0x1f));
          if (0xfff < (int)uVar44 || (uVar44 & uVar30) != 0) {
            iVar27 = iVar56;
            uVar60 = uVar30;
          }
          goto LAB_00127949;
        }
      }
    }
    else {
      pcVar11 = "unknown code";
    }
  }
  goto LAB_0012744e;
LAB_00125ad3:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_00125daa;
LAB_00126f35:
  stbi__g_failure_reason = "bad file";
LAB_00125f93:
  free(psVar31);
  psVar31 = (stbi__jpeg *)0x0;
LAB_00125f9a:
  *x = uVar57;
  *y = uVar58;
  bVar66 = req_comp != 0;
  if (bVar66) {
    local_4c8 = req_comp;
  }
  req_comp = local_4c8;
  if (!bVar66 && comp != (int *)0x0) {
    req_comp = *comp;
  }
  uVar28 = 4;
  goto LAB_00125fda;
LAB_00127b7a:
  pcVar11 = "illegal code in raster";
  goto LAB_0012744e;
LAB_00127ae3:
  do {
    stbi__skip(s,n);
    bVar12 = stbi__get8(s);
    n = (uint)bVar12;
  } while (bVar12 != 0);
LAB_00127afc:
  data_01 = *(stbi__context **)psVar31->huff_dc[0].fast;
  pcVar11 = stbi__g_failure_reason;
  if (data_01 != (stbi__context *)0x0) {
    if (local_510 != 0xffffffff) {
      psVar31->huff_dc[0].fast[(long)*(int *)(psVar31->huff_dc[0].fast + 0x1c) * 4 + 0x2b] =
           (stbi_uc)local_510;
    }
    pcVar11 = stbi__g_failure_reason;
    if (data_01 != s) {
      uVar57 = *(uint *)&psVar31->s;
      *x = uVar57;
      uVar58 = *(uint *)((long)&psVar31->s + 4);
      *y = uVar58;
      if ((req_comp & 0xfffffffbU) != 0) {
        data_01 = (stbi__context *)stbi__convert_format((uchar *)data_01,4,req_comp,uVar57,uVar58);
      }
      goto LAB_00125dba;
    }
  }
LAB_0012744e:
  stbi__g_failure_reason = pcVar11;
  free(*(void **)psVar31->huff_dc[0].fast);
  data_01 = (stbi__context *)0x0;
LAB_00125dba:
  free(psVar31);
  return data_01;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}